

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx_locks.c
# Opt level: O2

int main(void)

{
  int iVar1;
  time_t tVar2;
  code *__start_routine;
  uint i;
  long lVar3;
  uint i_1;
  pthread_t *__newthread;
  long in_FS_OFFSET;
  pfx_table pfxt;
  pthread_t threads [279];
  undefined1 auStack_118 [8];
  undefined1 *local_110;
  pfx_table local_108;
  pthread_t local_b8 [16];
  undefined8 local_38;
  
  local_110 = auStack_118;
  local_38 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pfx_table_init(&local_108,(pfx_update_fp)0x0);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  __newthread = local_b8;
  for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
    iVar1 = rand();
    __start_routine = rec_add;
    if (((iVar1 + 0x2aaaaaa9U < 0x55555553) ||
        (__start_routine = rec_del, iVar1 + 0xd5555556U < 0x2aaaaaaa)) ||
       (__start_routine = rec_val, iVar1 + 0xaaaaaaacU < 0x2aaaaaaa)) {
      pthread_create(__newthread,(pthread_attr_t *)0x0,__start_routine,&local_108);
    }
    printf("Started Thread %d\n");
    usleep(200);
    __newthread = __newthread + 1;
  }
  for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
    pthread_join(local_b8[lVar3],(void **)0x0);
    printf("Thread %i returned\n");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(local_110 + 0xe0)) {
    return 0;
  }
  *(code **)(local_110 + -8) = rec_add;
  __stack_chk_fail();
}

Assistant:

int main(void)
{
	unsigned int max_threads = 15;
	struct pfx_table pfxt;
	pthread_t threads[max_threads];

	pfx_table_init(&pfxt, NULL);
	srand(time(NULL));

	for (unsigned int i = 0; i < max_threads; i++) {
		int r = rand() / (RAND_MAX / 3);

		if (r == 0)
			pthread_create(&threads[i], NULL, (void *(*)(void *))rec_add, &pfxt);
		else if (r == 1)
			pthread_create(&threads[i], NULL, (void *(*)(void *))rec_del, &pfxt);
		else if (r == 2)
			pthread_create(&threads[i], NULL, (void *(*)(void *))rec_val, &pfxt);
		printf("Started Thread %d\n", i);
		usleep(200);
	}
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	return EXIT_SUCCESS;
}